

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O2

void __thiscall Client::requestAccessToken(Client *this)

{
  unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> uVar1;
  const_reference pvVar2;
  unsigned_long uVar3;
  long lVar4;
  Error error;
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  Json resultJson;
  Result result;
  string data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  spdlog::info<char[28]>((char (*) [28])"Requesting new access token");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,"grant_type=password",(allocator<char> *)&result);
  s_abi_cxx11_(&local_198,"&username=",10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &local_198,"");
  std::__cxx11::string::append((string *)&data);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&local_198);
  s_abi_cxx11_(&local_198,"&password=",10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &local_198,"");
  std::__cxx11::string::append((string *)&data);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"/api/v1/access_token",(allocator<char> *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&resultJson,"application/x-www-form-urlencoded",(allocator<char> *)&local_f8)
  ;
  httplib::Client::Post(&result,&this->tokenClient,&local_198,&data,(string *)&resultJson);
  std::__cxx11::string::~string((string *)&resultJson);
  std::__cxx11::string::~string((string *)&local_198);
  uVar1 = result.res_;
  httplib::to_string_abi_cxx11_(&local_198,(httplib *)(ulong)result.err_,error);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"File: ",&local_199);
  std::operator+(&local_78,&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/src/reddit/Client.h"
                );
  std::operator+(&local_58,&local_78,", Func: ");
  std::operator+(&local_f8,&local_58,"requestAccessToken");
  std::operator+(&local_d8,&local_f8,", Line: ");
  std::__cxx11::to_string(&local_b8,0x5d);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultJson,
                 &local_d8,&local_b8);
  check<char_const(&)[14],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            ((__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)
             uVar1._M_t.
             super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
             super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
             super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0,
             (char (*) [14])"Error state: ",&local_198,(char (*) [2])0x161c59,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resultJson);
  std::__cxx11::string::~string((string *)&resultJson);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_198);
  check<std::__cxx11::string_const&>
            (*(int *)((long)result.res_._M_t.
                            super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                            .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x20)
             == 200,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)result.res_._M_t.
                           super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                           .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x28));
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_28 = 0;
  uStack_20 = 0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string_const&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&resultJson,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)result.res_._M_t.
                    super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                    .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x78),
             (parser_callback_t *)&local_38,true,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  pvVar2 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&resultJson,"access_token");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_198,pvVar2);
  std::__cxx11::string::operator=((string *)&this->accessToken,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  pvVar2 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)&resultJson,"expires_in");
  uVar3 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<unsigned_long,_0>(pvVar2);
  lVar4 = std::chrono::_V2::system_clock::now();
  (this->accessTokenExpiration).__d.__r = lVar4 + -10000000000 + uVar3 * 1000000000;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&resultJson);
  httplib::Result::~Result(&result);
  std::__cxx11::string::~string((string *)&data);
  return;
}

Assistant:

void requestAccessToken() {
        spdlog::info("Requesting new access token");

        std::string data = "grant_type=password";
        data += "&username="s + bot_name;
        data += "&password="s + bot_password;

        const httplib::Result result = tokenClient.Post("/api/v1/access_token", data, "application/x-www-form-urlencoded");
        check(result, "Error state: ", httplib::to_string(result.error()), "\n", STD_HERE);
        check(result->status == 200, result->reason);

        const Json resultJson = Json::parse(result->body);

        accessToken = resultJson["access_token"].get<std::string>();
        accessTokenExpiration = std::chrono::seconds(resultJson["expires_in"].get<size_t>()) + Clock::now() - std::chrono::seconds(10);
    }